

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O1

MPP_RET mpp_trie_last_info(MppTrie trie)

{
  short sVar1;
  ushort uVar2;
  short sVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  MppTrie trie_00;
  int iVar17;
  uint uVar18;
  MPP_RET MVar19;
  void *pvVar20;
  MppTrieNode *pMVar21;
  MppTrieInfo *pMVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  char *pcVar26;
  long lVar27;
  undefined4 *puVar28;
  undefined8 *puVar29;
  void *pvVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  undefined2 uVar37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  undefined8 *puVar41;
  RK_S32 pos;
  ulong local_68;
  void *local_60;
  int local_54;
  ulong local_50;
  ulong local_48;
  int *local_40;
  MppTrie local_38;
  
  pos = 0;
  if (trie == (MppTrie)0x0) {
    _mpp_log_l(2,"mpp_trie","invalid NULL trie\n","mpp_trie_last_info");
    MVar19 = MPP_ERR_NULL_PTR;
  }
  else {
    pos = *(int *)((long)trie + 0x18) + 3;
    mpp_trie_add_info(trie,"__name__",*trie,*(RK_U32 *)((long)trie + 8));
    mpp_trie_add_info(trie,"__info__",&pos,4);
    local_40 = (int *)((long)trie + 0x2c);
    mpp_trie_add_info(trie,"__node__",local_40,4);
    local_60 = *(void **)((long)trie + 0x30);
    local_68 = (ulong)*(uint *)((long)trie + 0x2c);
    if (((byte)mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","shrink trie node start node %d info %d\n","mpp_trie_last_info",
                 local_68,(ulong)*(uint *)((long)trie + 0x18));
    }
    if (((byte)mpp_trie_debug & 0x40) != 0) {
      mpp_trie_dump(trie,"mpp_trie_last_info");
    }
    uVar33 = local_68 & 0xffffffff;
    pvVar20 = local_60;
    uVar24 = local_68;
    if (1 < (int)local_68) {
      uVar33 = local_68 & 0xffffffff;
      uVar40 = local_68;
      do {
        uVar35 = uVar40 - 1;
        puVar29 = (undefined8 *)((long)pvVar20 + uVar35 * 0x38);
        sVar1 = *(short *)((long)pvVar20 + uVar35 * 0x38 + 0x26);
        uVar39 = (ulong)sVar1;
        lVar27 = uVar39 * 0x38;
        uVar2 = *(ushort *)((long)pvVar20 + lVar27 + 0x34);
        uVar32 = (ulong)uVar2;
        if (uVar2 < 2) {
          sVar3 = *(short *)((long)puVar29 + 0x32);
          uVar39 = (ulong)(uint)(int)sVar3;
          if (sVar3 < 0x10) {
            puVar28 = (undefined4 *)(lVar27 + (long)pvVar20);
            if ((int)puVar28[8] < 0) {
              puVar28[8] = *(undefined4 *)(puVar29 + 4);
              *(short *)((long)puVar28 + 0x32) = sVar3 + 1;
              uVar32 = (ulong)*(ushort *)(puVar29 + 6) <<
                       ((*(byte *)((long)puVar29 + 0x32) & 0xf) << 2) | puVar29[5];
              *(ulong *)(puVar28 + 10) = uVar32;
              *(undefined2 *)(puVar28 + 0xd) = *(undefined2 *)((long)puVar29 + 0x34);
              uVar5 = *(undefined4 *)puVar29;
              uVar6 = *(undefined4 *)((long)puVar29 + 4);
              uVar7 = *(undefined4 *)(puVar29 + 1);
              uVar8 = *(undefined4 *)((long)puVar29 + 0xc);
              uVar9 = *(undefined4 *)((long)puVar29 + 0x14);
              uVar10 = *(undefined4 *)(puVar29 + 3);
              uVar11 = *(undefined4 *)((long)puVar29 + 0x1c);
              puVar28[4] = *(undefined4 *)(puVar29 + 2);
              puVar28[5] = uVar9;
              puVar28[6] = uVar10;
              puVar28[7] = uVar11;
              *puVar28 = uVar5;
              puVar28[1] = uVar6;
              puVar28[2] = uVar7;
              puVar28[3] = uVar8;
              if (((byte)mpp_trie_debug & 0x20) != 0) {
                local_50 = (ulong)(uint)(int)*(short *)(puVar28 + 9);
                local_54 = (int)uVar33;
                local_48 = uVar40;
                _mpp_log_l(4,"mpp_trie","node %d:%d shrink prev %d key %x tag %016llx -> %016llx\n",
                           "mpp_trie_last_info",uVar35 & 0xffffffff,(ulong)*(uint *)(puVar29 + 4),
                           local_50,(ulong)*(ushort *)(puVar28 + 0xc),puVar29[5],uVar32);
                uVar40 = local_48;
                pvVar20 = local_60;
                uVar24 = local_68;
              }
              lVar27 = 0;
              do {
                lVar23 = (long)*(short *)((long)puVar28 + lVar27 * 2);
                if (lVar23 != 0) {
                  *(short *)((long)pvVar20 + lVar23 * 0x38 + 0x26) = sVar1;
                }
                lVar27 = lVar27 + 1;
              } while (lVar27 != 0x10);
              puVar29[4] = 0;
              puVar29[5] = 0;
              puVar29[2] = 0;
              puVar29[3] = 0;
              *puVar29 = 0;
              puVar29[1] = 0;
              puVar29[6] = 0;
              *(undefined4 *)(puVar29 + 4) = 0xffffffff;
              uVar33 = (ulong)((int)uVar33 - 1);
            }
            else if (((byte)mpp_trie_debug & 0x20) != 0) {
              uVar34 = *(uint *)(puVar29 + 4);
              pcVar26 = "node %d:%d tag %d - %016llx stop shrinking for valid info node\n";
              goto LAB_00139685;
            }
          }
          else if (((byte)mpp_trie_debug & 0x20) != 0) {
            uVar34 = *(uint *)(puVar29 + 4);
            pcVar26 = "node %d:%d tag %d - %016llx stop shrinking for max tag len\n";
LAB_00139685:
            uVar32 = puVar29[5];
            goto LAB_00139696;
          }
        }
        else if (((byte)mpp_trie_debug & 0x20) != 0) {
          uVar34 = *(uint *)(puVar29 + 4);
          pcVar26 = "node %d:%d prev %d next count %d stop shrinking for multi next\n";
LAB_00139696:
          _mpp_log_l(4,"mpp_trie",pcVar26,"mpp_trie_last_info",uVar35 & 0xffffffff,(ulong)uVar34,
                     uVar39,uVar32);
          pvVar20 = local_60;
          uVar24 = local_68;
        }
        bVar4 = 2 < (long)uVar40;
        uVar40 = uVar35;
      } while (bVar4);
    }
    iVar17 = (int)uVar33;
    if (((byte)mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","shrink trie node finish count %d -> %d\n","mpp_trie_last_info",
                 local_68,uVar33);
      pvVar20 = local_60;
      uVar24 = local_68;
    }
    if (((byte)mpp_trie_debug & 0x40) != 0) {
      mpp_trie_dump(trie,"mpp_trie_last_info");
      pvVar20 = local_60;
      uVar24 = local_68;
    }
    if (((byte)mpp_trie_debug & 0x80) != 0) {
      mpp_trie_check(trie,"shrink merge tag stage");
      pvVar20 = local_60;
      uVar24 = local_68;
    }
    local_38 = trie;
    if (((byte)mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","move trie node start to reduce memory %d -> %d\n",
                 "mpp_trie_last_info",local_68,uVar33);
      pvVar20 = local_60;
      uVar24 = local_68;
    }
    local_54 = iVar17;
    if (1 < iVar17) {
      local_48 = (ulong)(int)uVar24;
      uVar40 = 1;
      pvVar30 = pvVar20;
      local_50 = uVar33;
      do {
        pvVar30 = (void *)((long)pvVar30 + 0x38);
        if ((long)uVar40 < (long)local_48 && *(short *)((long)pvVar20 + uVar40 * 0x38 + 0x24) == 0)
        {
          puVar29 = (undefined8 *)(uVar40 * 0x38 + (long)pvVar20);
          uVar33 = uVar40 & 0xffffffff;
          do {
            sVar1 = *(short *)((long)pvVar20 + uVar33 * 0x38 + 0x24);
            if (sVar1 != 0) {
              puVar41 = (undefined8 *)(uVar33 * 0x38 + (long)pvVar20);
              if (((byte)mpp_trie_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_trie","move node %d to %d prev %d\n","mpp_trie_last_info",uVar33,
                           uVar40 & 0xffffffff,(ulong)(uint)(int)*(short *)((long)puVar41 + 0x26));
                pvVar20 = local_60;
                uVar24 = local_68;
              }
              lVar27 = 0;
              do {
                uVar37 = (undefined2)uVar40;
                if (*(short *)((long)pvVar20 +
                              lVar27 * 2 + (long)*(short *)((long)puVar41 + 0x26) * 0x38) ==
                    *(short *)((long)puVar41 + 0x24)) {
                  *(undefined2 *)
                   ((long)pvVar20 + lVar27 * 2 + (long)*(short *)((long)puVar41 + 0x26) * 0x38) =
                       uVar37;
                  break;
                }
                lVar27 = lVar27 + 1;
              } while (lVar27 != 0x10);
              uVar12 = *puVar41;
              uVar13 = puVar41[1];
              uVar14 = puVar41[2];
              uVar15 = puVar41[3];
              uVar16 = puVar41[5];
              puVar29[4] = puVar41[4];
              puVar29[5] = uVar16;
              puVar29[6] = puVar41[6];
              puVar29[2] = uVar14;
              puVar29[3] = uVar15;
              *puVar29 = uVar12;
              puVar29[1] = uVar13;
              *(undefined2 *)((long)puVar29 + 0x24) = uVar37;
              puVar41[4] = 0;
              puVar41[5] = 0;
              puVar41[2] = 0;
              puVar41[3] = 0;
              *puVar41 = 0;
              puVar41[1] = 0;
              puVar41[6] = 0;
              lVar27 = 0;
              do {
                lVar23 = (long)*(short *)((long)pvVar30 + lVar27 * 2);
                if (lVar23 != 0) {
                  *(undefined2 *)((long)pvVar20 + lVar23 * 0x38 + 0x26) = uVar37;
                }
                lVar27 = lVar27 + 1;
              } while (lVar27 != 0x10);
              if (sVar1 != 0) break;
            }
            uVar34 = (int)uVar33 + 1;
            uVar33 = (ulong)uVar34;
          } while ((int)uVar34 < (int)uVar24);
        }
        uVar40 = uVar40 + 1;
      } while (uVar40 != local_50);
    }
    *local_40 = local_54;
    if (((byte)mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","move trie node finish used %d\n","mpp_trie_last_info");
    }
    trie_00 = local_38;
    if (((byte)mpp_trie_debug & 0x40) != 0) {
      mpp_trie_dump(local_38,"mpp_trie_last_info");
    }
    if (((byte)mpp_trie_debug & 0x80) != 0) {
      mpp_trie_check(trie_00,"shrink move node stage");
    }
    if (((byte)mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","create user buffer start\n","mpp_trie_last_info");
    }
    iVar38 = *(int *)((long)trie_00 + 0x2c) * 0x38;
    iVar17 = iVar38 + *(int *)((long)trie_00 + 0x18) * 4 + *(int *)((long)trie_00 + 0x4c) +
             *(int *)((long)trie_00 + 0x54);
    *(int *)((long)trie_00 + 0xc) = iVar17;
    pvVar20 = mpp_osal_calloc("mpp_trie_last_info",(long)iVar17);
    if (pvVar20 == (void *)0x0) {
      _mpp_log_l(2,"mpp_trie","failed to alloc trie buffer size %d\n",(char *)0x0,0);
      MVar19 = MPP_NOK;
    }
    else {
      *(void **)((long)trie_00 + 0x30) = pvVar20;
      memcpy(pvVar20,local_60,(long)iVar38);
      pos = iVar38;
      if (0 < *(int *)((long)trie_00 + 0x18)) {
        lVar27 = 0x10;
        uVar24 = 0;
        do {
          lVar23 = *(long *)((long)trie_00 + 0x20);
          pcVar26 = (char *)((long)*(int *)(lVar23 + lVar27) + *(long *)((long)trie_00 + 0x40));
          local_68 = uVar24;
          pMVar21 = mpp_trie_get_node(*(MppTrieNode **)((long)trie_00 + 0x30),pcVar26);
          lVar36 = (long)pos;
          pMVar21->id = pos;
          uVar18 = *(uint *)(lVar23 + -0x10 + lVar27) & 0xfff;
          uVar34 = *(uint *)((long)pvVar20 + lVar36);
          *(uint *)((long)pvVar20 + lVar36) = uVar34 & 0xfffff000 | uVar18;
          uVar25 = (*(uint *)(lVar23 + -0xc + lVar27) & 0xfff) << 0xc;
          *(uint *)((long)pvVar20 + lVar36) = uVar34 & 0xff000000 | uVar18 | uVar25;
          *(uint *)((long)pvVar20 + lVar36) =
               *(int *)(lVar23 + -8 + lVar27) << 0x18 | uVar25 | uVar18;
          pos = pos + 4;
          strncpy((char *)((long)pos + (long)pvVar20),pcVar26,
                  (ulong)*(byte *)((long)pvVar20 + lVar36 + 3));
          lVar31 = (long)pos + (ulong)*(byte *)((long)pvVar20 + lVar36 + 3);
          pos = (RK_S32)lVar31;
          memcpy((void *)(lVar31 + (long)pvVar20),
                 (void *)((long)*(int *)(lVar23 + -4 + lVar27) + *(long *)((long)trie_00 + 0x38)),
                 (long)*(int *)(lVar23 + -0xc + lVar27));
          pos = pos + (*(uint *)((long)pvVar20 + lVar36) >> 0xc & 0xfff);
          uVar24 = local_68 + 1;
          lVar27 = lVar27 + 0x14;
        } while ((long)uVar24 < (long)*(int *)((long)trie_00 + 0x18));
      }
      if (local_60 != (void *)0x0) {
        mpp_osal_free("mpp_trie_last_info",local_60);
      }
      if (*(void **)((long)trie_00 + 0x20) != (void *)0x0) {
        mpp_osal_free("mpp_trie_last_info",*(void **)((long)trie_00 + 0x20));
      }
      *(undefined8 *)((long)trie_00 + 0x20) = 0;
      if (*(void **)((long)trie_00 + 0x38) != (void *)0x0) {
        mpp_osal_free("mpp_trie_last_info",*(void **)((long)trie_00 + 0x38));
      }
      *(undefined8 *)((long)trie_00 + 0x38) = 0;
      if (*(void **)((long)trie_00 + 0x40) != (void *)0x0) {
        mpp_osal_free("mpp_trie_last_info",*(void **)((long)trie_00 + 0x40));
      }
      *(undefined8 *)((long)trie_00 + 0x40) = 0;
      pMVar22 = mpp_trie_get_info_from_root(*(void **)((long)trie_00 + 0x30),"__node__");
      MVar19 = MPP_OK;
      if (pMVar22 != (MppTrieInfo *)0x0) {
        *(int *)(&pMVar22[1].field_0x0 + (byte)pMVar22->field_0x3) = *local_40;
        MVar19 = MPP_OK;
      }
    }
  }
  return MVar19;
}

Assistant:

MPP_RET mpp_trie_last_info(MppTrie trie)
{
    MppTrieImpl *p = (MppTrieImpl *)trie;
    MppTrieNode *root;
    MppTrieNode *node;
    char *buf;
    RK_S32 node_count;
    RK_S32 node_valid;
    RK_S32 nodes_size;
    RK_S32 len = 0;
    RK_S32 pos = 0;
    RK_S32 i;
    RK_S32 j;

    if (!trie) {
        mpp_err_f("invalid NULL trie\n");
        return MPP_ERR_NULL_PTR;
    }

    /* write trie self entry info */
    pos = p->info_used + 3;
    mpp_trie_add_info(trie, "__name__", p->name, p->name_len);
    mpp_trie_add_info(trie, "__info__", &pos, sizeof(pos));
    /* NOTE: node count need to be update after shrinking */
    mpp_trie_add_info(trie, "__node__", &p->node_used, sizeof(p->node_used));

    root = p->nodes;
    node_count = p->node_used;
    node_valid = node_count;

    trie_dbg_last("shrink trie node start node %d info %d\n", node_count, p->info_used);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_STEP)
        mpp_trie_dump_f(trie);

    for (i = node_count - 1; i > 0; i--) {
        MppTrieNode *prev;
        RK_S32 prev_idx;

        node = &root[i];
        prev_idx = node->prev;
        prev = &root[prev_idx];

        if (prev->next_cnt > 1) {
            trie_dbg_last("node %d:%d prev %d next count %d stop shrinking for multi next\n",
                          i, node->id, prev_idx, prev->next_cnt);
            continue;
        }

        if (node->tag_len >= (RK_S16)MPP_TRIE_TAG_LEN_MAX) {
            trie_dbg_last("node %d:%d tag %d - %016llx stop shrinking for max tag len\n",
                          i, node->id, node->tag_len, node->tag_val);
            continue;
        }

        if (prev->id >= 0) {
            trie_dbg_last("node %d:%d tag %d - %016llx stop shrinking for valid info node\n",
                          i, node->id, node->tag_len, node->tag_val);
            continue;
        }

        prev->id = node->id;
        /* NOTE: do NOT increase tag length on root node */
        prev->tag_len = node->tag_len + 1;
        prev->tag_val = ((RK_U64)node->key << (node->tag_len * 4)) | node->tag_val;
        prev->next_cnt = node->next_cnt;
        memcpy(prev->next, node->next, sizeof(node->next));

        trie_dbg_last("node %d:%d shrink prev %d key %x tag %016llx -> %016llx\n",
                      i, node->id, prev->idx, prev->key, node->tag_val, prev->tag_val);

        for (j = 0; j < MPP_TRIE_KEY_MAX; j++) {
            if (!prev->next[j])
                continue;

            root[prev->next[j]].prev = prev_idx;
        }

        memset(node, 0, sizeof(*node));
        node->id = INVALID_NODE_ID;
        node_valid--;
    }

    trie_dbg_last("shrink trie node finish count %d -> %d\n", node_count, node_valid);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_STEP)
        mpp_trie_dump_f(trie);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_CHECK)
        mpp_trie_check(trie, "shrink merge tag stage");

    trie_dbg_last("move trie node start to reduce memory %d -> %d\n", node_count, node_valid);

    for (i = 1; i < node_valid; i++) {
        node = &root[i];

        /* skip valid node */
        if (node->idx)
            continue;

        for (j = i; j < node_count; j++) {
            MppTrieNode *tmp = &root[j];
            MppTrieNode *prev;
            RK_S32 k;

            /* skip empty node */
            if (!tmp->idx)
                continue;

            trie_dbg_last("move node %d to %d prev %d\n", j, i, tmp->prev);

            prev = &root[tmp->prev];

            /* relink previous node */
            for (k = 0; k < MPP_TRIE_KEY_MAX; k++) {
                if (prev->next[k] != tmp->idx)
                    continue;

                prev->next[k] = i;
                break;
            }

            memcpy(node, tmp, sizeof(*node));
            node->idx = i;
            memset(tmp, 0, sizeof(*tmp));

            /* relink next node */
            for (k = 0; k < MPP_TRIE_KEY_MAX; k++) {
                if (!node->next[k])
                    continue;

                root[node->next[k]].prev = i;
            }

            break;
        }
    }

    p->node_used = node_valid;

    trie_dbg_last("move trie node finish used %d\n", p->node_used);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_STEP)
        mpp_trie_dump_f(trie);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_CHECK)
        mpp_trie_check(trie, "shrink move node stage");

    trie_dbg_last("create user buffer start\n");

    nodes_size = sizeof(MppTrieNode) * p->node_used;
    p->buf_size = nodes_size + sizeof(MppTrieInfo) * p->info_used + p->info_buf_pos + p->name_buf_pos;

    buf = mpp_calloc_size(char, p->buf_size);
    if (!buf) {
        mpp_loge("failed to alloc trie buffer size %d\n", len);
        return MPP_NOK;
    }

    p->nodes = (MppTrieNode *)buf;
    memcpy(p->nodes, root, nodes_size);
    pos = nodes_size;

    for (i = 0; i < p->info_used; i++) {
        MppTrieInfoInt *src = &p->info[i];
        MppTrieInfo *dst;
        const char *name = (char *)p->name_buf + src->name_offset;

        node = mpp_trie_get_node(p->nodes, name);
        node->id = pos;

        /* reserve node info */
        dst = (MppTrieInfo *)(buf + pos);
        dst->index = src->index;
        dst->ctx_len = src->ctx_len;
        dst->str_len = src->str_len;
        pos += sizeof(MppTrieInfo);

        /* copy info name */
        strncpy(buf + pos, name, dst->str_len);
        pos += dst->str_len;

        /* reserve user context space */
        memcpy(buf + pos, (char *)p->info_buf + src->ctx_offset, src->ctx_len);
        pos += dst->ctx_len;
    }

    MPP_FREE(root);
    MPP_FREE(p->info);
    MPP_FREE(p->info_buf);
    MPP_FREE(p->name_buf);

    /* NOTE: udpate final shrinked node count */
    {
        MppTrieInfo *info = mpp_trie_get_info_from_root(p->nodes, "__node__");

        if (info)
            *(RK_U32 *)mpp_trie_info_ctx(info) = p->node_used;
    }

    return MPP_OK;
}